

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O0

void sysbvm_stackFrame_iterateGCRootsInRecordWith
               (sysbvm_stackFrameRecord_t *record,void *userdata,
               sysbvm_GCRootIterationFunction_t *iterationFunction)

{
  sysbvm_stackFrameCleanupRecord_t *cleanupRecord;
  sysbvm_stackFrameLandingPadRecord_t *landingPadRecord;
  sysbvm_stackFrameSourcePositionRecord_t *sourcePositionRecord;
  sysbvm_stackFrameContinueTargetRecord_t *continueRecord;
  sysbvm_stackFrameBreakTargetRecord_t *breakRecord;
  size_t i_6;
  size_t i_5;
  size_t i_4;
  sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t *functionRecord_2;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  sysbvm_stackFrameBytecodeFunctionActivationRecord_t *functionRecord_1;
  sysbvm_stackFrameFunctionActivationRecord_t *functionRecord;
  size_t i;
  sysbvm_stackFrameGCRootsRecord_t *rootRecord;
  sysbvm_GCRootIterationFunction_t *iterationFunction_local;
  void *userdata_local;
  sysbvm_stackFrameRecord_t *record_local;
  
  switch(record->type) {
  case SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS:
    for (functionRecord = (sysbvm_stackFrameFunctionActivationRecord_t *)0x0;
        functionRecord < (sysbvm_stackFrameFunctionActivationRecord_t *)record[1].previous;
        functionRecord =
             (sysbvm_stackFrameFunctionActivationRecord_t *)((long)&functionRecord->previous + 1)) {
      (*iterationFunction)
                (userdata,(sysbvm_tuple_t *)(*(long *)&record[1].type + (long)functionRecord * 8));
    }
    break;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 1));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[1].type);
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 2));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[2].type);
    break;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 1));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[1].type);
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 2));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[2].type);
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 3));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[3].type);
    for (i_2 = 0; i_2 < record[4].previous; i_2 = i_2 + 1) {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)(*(long *)&record[4].type + i_2 * 8));
    }
    for (i_3 = 0; i_3 < record[5].previous; i_3 = i_3 + 1) {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)(*(long *)&record[5].type + i_3 * 8));
    }
    for (functionRecord_2 = (sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t *)0x0;
        functionRecord_2 < (sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t *)0x40;
        functionRecord_2 =
             (sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t *)
             ((long)&functionRecord_2->previous + 1)) {
      (*iterationFunction)
                (userdata,(sysbvm_tuple_t *)(&record[6].previous + (long)functionRecord_2));
    }
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 0x26));
    break;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 2));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[2].type);
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 3));
    for (i_5 = 0; i_5 < *(ulong *)&record[3].type; i_5 = i_5 + 1) {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)(&(record[4].previous)->previous + i_5));
    }
    for (i_6 = 0; i_6 < *(ulong *)&record[4].type; i_6 = i_6 + 1) {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)(&record[5].previous + i_6));
    }
    for (breakRecord = (sysbvm_stackFrameBreakTargetRecord_t *)0x0;
        breakRecord < (sysbvm_stackFrameBreakTargetRecord_t *)record[0xd].previous;
        breakRecord = (sysbvm_stackFrameBreakTargetRecord_t *)((long)&breakRecord->previous + 1)) {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)(&record[0xd].type + (long)breakRecord * 2));
    }
    break;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 1));
    break;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 1));
    break;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 1));
    break;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 1));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[1].type);
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 2));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[2].type);
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 3));
    break;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 1));
    break;
  default:
    abort();
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_stackFrame_iterateGCRootsInRecordWith(sysbvm_stackFrameRecord_t *record, void *userdata, sysbvm_GCRootIterationFunction_t iterationFunction)
{
    switch(record->type)
    {
    case SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS:
        {
            sysbvm_stackFrameGCRootsRecord_t *rootRecord = (sysbvm_stackFrameGCRootsRecord_t*)record;
            for(size_t i = 0; i < rootRecord->rootCount; ++i)
                iterationFunction(userdata, &rootRecord->roots[i]);
        }
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION:
        {
            sysbvm_stackFrameFunctionActivationRecord_t *functionRecord = (sysbvm_stackFrameFunctionActivationRecord_t*)record;
            iterationFunction(userdata, &functionRecord->function);
            iterationFunction(userdata, &functionRecord->functionDefinition);
            iterationFunction(userdata, &functionRecord->applicationEnvironment);
            iterationFunction(userdata, &functionRecord->result);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION:
        {
            sysbvm_stackFrameBytecodeFunctionActivationRecord_t *functionRecord = (sysbvm_stackFrameBytecodeFunctionActivationRecord_t*)record;
            iterationFunction(userdata, &functionRecord->function);
            iterationFunction(userdata, &functionRecord->functionDefinition);
            iterationFunction(userdata, &functionRecord->functionBytecode);

            iterationFunction(userdata, &functionRecord->captureVector);
            iterationFunction(userdata, &functionRecord->literalVector);
            iterationFunction(userdata, &functionRecord->instructions);

            for(size_t i = 0; i < functionRecord->argumentCount; ++i)
                iterationFunction(userdata, functionRecord->arguments + i);

            for(size_t i = 0; i < functionRecord->inlineLocalVectorSize; ++i)
                iterationFunction(userdata, functionRecord->inlineLocalVector + i);

            for(size_t i = 0; i < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE; ++i)
                iterationFunction(userdata, functionRecord->operandRegisterFile + i);

            iterationFunction(userdata, &functionRecord->result);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION:
        {
            sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t *functionRecord = (sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t*)record;

            iterationFunction(userdata, &functionRecord->literalVector);
            iterationFunction(userdata, &functionRecord->captureVector);
            iterationFunction(userdata, &functionRecord->function);

            for(size_t i = 0; i < functionRecord->argumentCount; ++i)
                iterationFunction(userdata, functionRecord->arguments + i);

            for(size_t i = 0; i < functionRecord->callArgumentVectorSize; ++i)
                iterationFunction(userdata, functionRecord->callArgumentVector + i);

            for(size_t i = 0; i < functionRecord->inlineLocalVectorSize; ++i)
                iterationFunction(userdata, functionRecord->inlineLocalVector + i);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET:
        {
            sysbvm_stackFrameBreakTargetRecord_t *breakRecord = (sysbvm_stackFrameBreakTargetRecord_t*)record;
            iterationFunction(userdata, &breakRecord->environment);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET:
        {
            sysbvm_stackFrameContinueTargetRecord_t *continueRecord = (sysbvm_stackFrameContinueTargetRecord_t*)record;
            iterationFunction(userdata, &continueRecord->environment);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION:
        {
            sysbvm_stackFrameSourcePositionRecord_t *sourcePositionRecord = (sysbvm_stackFrameSourcePositionRecord_t*)record;
            iterationFunction(userdata, &sourcePositionRecord->sourcePosition);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD:
        {
            sysbvm_stackFrameLandingPadRecord_t *landingPadRecord = (sysbvm_stackFrameLandingPadRecord_t*)record;
            iterationFunction(userdata, &landingPadRecord->exceptionFilter);
            iterationFunction(userdata, &landingPadRecord->stackTrace);
            iterationFunction(userdata, &landingPadRecord->exception);
            iterationFunction(userdata, &landingPadRecord->action);
            iterationFunction(userdata, &landingPadRecord->actionResult);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP:
        {
            sysbvm_stackFrameCleanupRecord_t *cleanupRecord = (sysbvm_stackFrameCleanupRecord_t*)record;
            iterationFunction(userdata, &cleanupRecord->action);
        }   
        break;
    default:
        // Should not reach here.
        abort();
        break;
    }
}